

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEnginePrivate::checkProxy(QNativeSocketEnginePrivate *this,QHostAddress *address)

{
  long lVar1;
  QObject *object;
  QNetworkProxy QVar2;
  bool bVar3;
  SocketType SVar4;
  ProxyType PVar5;
  QAbstractSocket *this_00;
  QTcpServer *pQVar6;
  bool bVar7;
  QueryType type;
  long in_FS_OFFSET;
  QArrayDataPointer<QNetworkProxy> local_58;
  QNetworkProxyQuery query;
  QNetworkProxy proxy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QHostAddress::isLoopback(address);
  bVar7 = true;
  if (bVar3) goto LAB_001b812b;
  object = *(QObject **)
            (*(long *)(*(long *)&(this->super_QAbstractSocketEnginePrivate).field_0x8 + 8) + 0x10);
  proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::QNetworkProxy(&proxy);
  this_00 = QtPrivate::qobject_cast_helper<QAbstractSocket*,QObject>(object);
  if (this_00 == (QAbstractSocket *)0x0) {
    pQVar6 = QtPrivate::qobject_cast_helper<QTcpServer*,QObject>(object);
    if (pQVar6 != (QTcpServer *)0x0) {
      QTcpServer::proxy((QTcpServer *)&local_58);
      QVar2 = proxy;
      proxy.d.d.ptr =
           (QSharedDataPointer<QNetworkProxyPrivate>)
           (QSharedDataPointer<QNetworkProxyPrivate>)local_58.d;
      local_58.d = (Data *)QVar2.d.d.ptr;
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
      type = TcpServer;
      goto LAB_001b8098;
    }
    bVar7 = true;
  }
  else {
    QAbstractSocket::proxy((QAbstractSocket *)&local_58);
    QVar2 = proxy;
    proxy.d.d.ptr =
         (QSharedDataPointer<QNetworkProxyPrivate>)
         (QSharedDataPointer<QNetworkProxyPrivate>)local_58.d;
    local_58.d = (Data *)QVar2.d.d.ptr;
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
    SVar4 = QAbstractSocket::socketType(this_00);
    type = (uint)(SVar4 == SctpSocket) * 2;
    if (SVar4 == UdpSocket) {
      type = UdpSocket;
    }
LAB_001b8098:
    PVar5 = QNetworkProxy::type(&proxy);
    if (PVar5 == DefaultProxy) {
      query.d.d.ptr = (QSharedDataPointer<QNetworkProxyQueryPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkProxyQuery::QNetworkProxyQuery(&query);
      QNetworkProxyQuery::setQueryType(&query,type);
      QNetworkProxyFactory::proxyForQuery((QList<QNetworkProxy> *)&local_58,&query);
      QNetworkProxy::operator=(&proxy,local_58.ptr);
      QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_58);
      QNetworkProxyQuery::~QNetworkProxyQuery(&query);
    }
    PVar5 = QNetworkProxy::type(&proxy);
    bVar7 = true;
    if ((PVar5 != DefaultProxy) && (PVar5 = QNetworkProxy::type(&proxy), PVar5 != NoProxy)) {
      setError(this,UnsupportedSocketOperationError,InvalidProxyTypeString);
      bVar7 = false;
    }
  }
  QNetworkProxy::~QNetworkProxy(&proxy);
LAB_001b812b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QNativeSocketEnginePrivate::checkProxy(const QHostAddress &address)
{
    if (address.isLoopback())
        return true;

#if !defined(QT_NO_NETWORKPROXY)
    QObject *parent = q_func()->parent();
    QNetworkProxy proxy;
    QNetworkProxyQuery::QueryType queryType = QNetworkProxyQuery::TcpSocket;
    if (QAbstractSocket *socket = qobject_cast<QAbstractSocket *>(parent)) {
        proxy = socket->proxy();
        switch (socket->socketType()) {
        case QAbstractSocket::UdpSocket:
            queryType = QNetworkProxyQuery::UdpSocket;
            break;
        case QAbstractSocket::SctpSocket:
            queryType = QNetworkProxyQuery::SctpSocket;
            break;
        case QAbstractSocket::TcpSocket:
        case QAbstractSocket::UnknownSocketType:
            queryType = QNetworkProxyQuery::TcpSocket;
        }
    } else if (QTcpServer *server = qobject_cast<QTcpServer *>(parent)) {
        proxy = server->proxy();
        queryType = QNetworkProxyQuery::TcpServer;
#ifndef QT_NO_SCTP
        if (qobject_cast<QSctpServer *>(server))
            queryType = QNetworkProxyQuery::SctpServer;
#endif
    } else {
        // no parent -> no proxy
        return true;
    }

    if (proxy.type() == QNetworkProxy::DefaultProxy) {
        // This is similar to what we have in QNetworkProxy::applicationProxy,
        // the only difference is that we provide the correct query type instead of
        // always using TcpSocket unconditionally (this is the default type for
        // QNetworkProxyQuery).
        QNetworkProxyQuery query;
        query.setQueryType(queryType);
        proxy = QNetworkProxyFactory::proxyForQuery(query).constFirst();
    }

    if (proxy.type() != QNetworkProxy::DefaultProxy &&
        proxy.type() != QNetworkProxy::NoProxy) {
        // QNativeSocketEngine doesn't do proxies
        setError(QAbstractSocket::UnsupportedSocketOperationError,
                 QNativeSocketEnginePrivate::InvalidProxyTypeString);
        return false;
    }
#endif

    return true;
}